

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

PortExpressionSyntax * __thiscall slang::parsing::Parser::parsePortExpression(Parser *this)

{
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  PortReferenceSyntax *pPVar4;
  undefined4 extraout_var;
  PortConcatenationSyntax *pPVar6;
  Info *pIVar7;
  Info *pIVar8;
  Info *extraout_RDX;
  size_t extraout_RDX_00;
  BumpAllocator *dst;
  TokenKind TVar9;
  ulong uVar10;
  TokenKind TVar11;
  Token current_00;
  Token TVar12;
  Token closeBrace;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_200;
  undefined1 local_1f0;
  Token openBrace;
  Token current;
  SeparatedSyntaxList<slang::syntax::PortReferenceSyntax> local_1c8 [7];
  pointer pTVar5;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
  if (!bVar1) {
    pPVar4 = parsePortReference(this);
    return &pPVar4->super_PortExpressionSyntax;
  }
  Token::Token(&openBrace);
  Token::Token(&closeBrace);
  openBrace = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  if ((openBrace._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&openBrace);
    closeBrace = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar3);
    local_1c8[0].super_SyntaxListBase.childCount = 0;
    pTVar5 = (pointer)0x0;
    goto LAB_001b6cbc;
  }
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x10;
  current_00 = ParserBase::peek(&this->super_ParserBase);
  current = current_00;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(current_00.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
    }
LAB_001b6af2:
    closeBrace = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    pIVar7 = closeBrace.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(current_00.kind);
    if (bVar1) {
      do {
        do {
          pIVar7 = current_00.info;
          pPVar4 = parsePortReference(this);
          local_200._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar4;
          local_1f0 = 1;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_200._M_first);
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          TVar11 = TVar12.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar11);
          if (TVar11 == EndOfFile || bVar1) goto LAB_001b6af2;
          if (TVar11 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) goto LAB_001b6af2;
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_200._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_1f0 = 0;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_200._M_first);
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          pIVar8 = TVar12.info;
          TVar11 = TVar12.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar11);
          if (TVar11 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            goto LAB_001b6af2;
          }
          TVar9 = current_00.kind;
          uVar10 = TVar12._0_8_ & 0xffffffff;
          current_00.info = pIVar8;
          current_00.kind = (short)uVar10;
          current_00._2_1_ = (char)(uVar10 >> 0x10);
          current_00.numFlags.raw = (char)(uVar10 >> 0x18);
          current_00.rawLen = (int)(uVar10 >> 0x20);
        } while (pIVar7 != pIVar8 || TVar9 != TVar11);
        bVar1 = ParserBase::
                skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                          (&this->super_ParserBase,(DiagCode)0x10001,true);
        uVar10 = TVar12._0_8_ & 0xffffffff;
        current_00.kind = (short)uVar10;
        current_00._2_1_ = (char)(uVar10 >> 0x10);
        current_00.numFlags.raw = (char)(uVar10 >> 0x18);
        current_00.rawLen = (int)(uVar10 >> 0x20);
      } while (bVar1);
      goto LAB_001b6af2;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,current_00,CloseBrace,&closeBrace,(DiagCode)0x10001);
    pIVar7 = extraout_RDX;
  }
  dst = (this->super_ParserBase).alloc;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst,
                     (EVP_PKEY_CTX *)pIVar7);
  pTVar5 = (pointer)CONCAT44(extraout_var,iVar2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst);
  local_1c8[0].super_SyntaxListBase.childCount = extraout_RDX_00;
LAB_001b6cbc:
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e7fa8;
  local_1c8[0].elements._M_ptr = pTVar5;
  local_1c8[0].elements._M_extent._M_extent_value = local_1c8[0].super_SyntaxListBase.childCount;
  pPVar6 = slang::syntax::SyntaxFactory::portConcatenation
                     (&this->factory,openBrace,local_1c8,closeBrace);
  return &pPVar6->super_PortExpressionSyntax;
}

Assistant:

PortExpressionSyntax& Parser::parsePortExpression() {
    if (peek(TokenKind::OpenBrace)) {
        Token openBrace, closeBrace;
        std::span<TokenOrSyntax> items;

        parseList<isIdentifierOrComma, isEndOfBracedList>(
            TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBrace, items,
            closeBrace, RequireItems::True, diag::ExpectedExpression,
            [this] { return &parsePortReference(); });

        return factory.portConcatenation(openBrace, items, closeBrace);
    }
    return parsePortReference();
}